

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  not_null<slang::syntax::UdpPortListSyntax_*> *this;
  Scope *pSVar1;
  Token *this_00;
  Compilation *args;
  size_type sVar2;
  size_type sVar3;
  long lVar4;
  UdpInitialStmtSyntax *this_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  Token nameToken;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined1 auVar5 [16];
  pointer ppPVar6;
  bool bVar7;
  logic_t lVar8;
  logic_t lVar9;
  int iVar10;
  bitwidth_t bVar11;
  PrimitiveSymbol *pPVar12;
  UdpPortListSyntax *pUVar13;
  SyntaxNode *pSVar14;
  AnsiUdpPortListSyntax *pAVar15;
  UdpPortDeclSyntax *pUVar16;
  UdpOutputPortDeclSyntax *pUVar17;
  SourceLocation SVar18;
  PrimitivePortSymbol *pPVar19;
  ulong uVar20;
  UdpInputPortDeclSyntax *pUVar21;
  IdentifierNameSyntax *pIVar22;
  NonAnsiUdpPortListSyntax *pNVar23;
  UdpBodySyntax *pUVar24;
  logic_error *this_02;
  iterator iVar25;
  Info *pIVar26;
  reference ppPVar27;
  undefined4 extraout_var;
  Diagnostic *pDVar28;
  undefined4 extraout_var_00;
  Type *this_04;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_05;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *pSVar29;
  ParentList *pPVar30;
  ParentList *pPVar31;
  EVP_PKEY_CTX *extraout_RDX;
  size_type extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *pEVar32;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  DiagCode code;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *pSVar33;
  char cVar34;
  long lVar35;
  long lVar36;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> sVar37;
  SourceRange SVar38;
  string_view sVar39;
  LookupLocation lookupLocation;
  UdpOutputPortDeclSyntax *local_230;
  PrimitivePortDirection local_224;
  PrimitiveSymbol *local_220;
  iterator __begin5;
  PrimitivePortSymbol *port;
  Info *pIStack_1f0;
  Compilation *local_1d0;
  Token name_2;
  PrimitivePortSymbol *port_1;
  char *local_188;
  anon_class_8_1_a89d2d74 checkDup;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  iterator __begin3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  Expression *this_03;
  
  args = scope->compilation;
  __begin3 = (iterator)parsing::Token::valueText(&syntax->name);
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ =
       (pointer)parsing::Token::location(&syntax->name);
  auVar5._12_4_ = 0;
  auVar5._0_12_ = (undefined1  [12])__begin5._4_12_;
  __begin5 = (iterator)(auVar5 << 0x20);
  local_1d0 = args;
  pPVar12 = BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&args->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)&__begin3,
                       (SourceLocation *)&ports,(PrimitiveKind *)&__begin5);
  sVar37 = slang::syntax::SyntaxList::operator_cast_to_span
                     ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&pPVar12->super_Symbol,scope,sVar37);
  (pPVar12->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_ =
       (pointer)ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.firstElement;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len = 0;
  ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.cap = 5;
  this = &syntax->portList;
  local_220 = pPVar12;
  pUVar13 = not_null<slang::syntax::UdpPortListSyntax_*>::get(this);
  if ((pUVar13->super_SyntaxNode).kind == AnsiUdpPortList) {
    pSVar14 = &not_null<slang::syntax::UdpPortListSyntax_*>::get(this)->super_SyntaxNode;
    pAVar15 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiUdpPortListSyntax>(pSVar14);
    pSVar29 = &pAVar15->ports;
    __begin3.index = 0;
    __begin3.list = pSVar29;
    sVar2 = (pAVar15->ports).elements.size_;
    pSVar1 = &local_220->super_Scope;
    uVar20 = 0;
    pPVar30 = pSVar29;
    while ((pPVar30 != pSVar29 || (uVar20 != sVar2 + 1 >> 1))) {
      pUVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                iterator_base<slang::syntax::UdpPortDeclSyntax_*>::operator*(&__begin3);
      if ((pUVar16->super_SyntaxNode).kind == UdpOutputPortDecl) {
        pUVar17 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                            (&pUVar16->super_SyntaxNode);
        port_1._0_4_ = 2 - (uint)((pUVar17->reg).info == (Info *)0x0);
        __begin5 = (iterator)parsing::Token::valueText(&pUVar17->name);
        SVar18 = parsing::Token::location(&pUVar17->name);
        name_2._0_8_ = SVar18;
        pPVar19 = BumpAllocator::
                  emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                            (&local_1d0->super_BumpAllocator,local_1d0,
                             (basic_string_view<char,_std::char_traits<char>_> *)&__begin5,
                             (SourceLocation *)&name_2,(PrimitivePortDirection *)&port_1);
        port = pPVar19;
        (pPVar19->super_ValueSymbol).super_Symbol.originatingSyntax = &pUVar16->super_SyntaxNode;
        syntax_00.data_ =
             (pUVar16->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
        syntax_00.size_ =
             (pUVar16->attributes).
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
        Symbol::setAttributes((Symbol *)pPVar19,scope,syntax_00);
        SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
        emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port);
        Scope::addMember(pSVar1,(Symbol *)port);
      }
      else {
        pUVar21 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                            (&pUVar16->super_SyntaxNode);
        pSVar33 = &pUVar21->names;
        __begin5.index = 0;
        __begin5.list = pSVar33;
        sVar3 = (pUVar21->names).elements.size_;
        uVar20 = 0;
        pPVar31 = pSVar33;
        while ((pPVar31 != pSVar33 || (uVar20 != sVar3 + 1 >> 1))) {
          pIVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*(&__begin5);
          _port = pIVar22->identifier;
          name_2 = (Token)parsing::Token::valueText((Token *)&port);
          checkDup.scope = (Scope *)parsing::Token::location((Token *)&port);
          local_224 = In;
          pPVar19 = BumpAllocator::
                    emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                              (&local_1d0->super_BumpAllocator,local_1d0,
                               (basic_string_view<char,_std::char_traits<char>_> *)&name_2,
                               (SourceLocation *)&checkDup,&local_224);
          port_1 = pPVar19;
          (pPVar19->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pIVar22;
          syntax_01.data_ =
               (pUVar16->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
          syntax_01.size_ =
               (pUVar16->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
          Symbol::setAttributes((Symbol *)pPVar19,scope,syntax_01);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_1);
          Scope::addMember(pSVar1,(Symbol *)port_1);
          uVar20 = __begin5.index + 1;
          __begin5.index = uVar20;
          pPVar31 = __begin5.list;
        }
      }
      uVar20 = __begin3.index + 1;
      __begin3.index = uVar20;
      pPVar30 = __begin3.list;
    }
    pUVar24 = not_null<slang::syntax::UdpBodySyntax_*>::get(&syntax->body);
    if ((pUVar24->portDecls).elements.size_ != 0) {
      pUVar24 = not_null<slang::syntax::UdpBodySyntax_*>::get(&syntax->body);
      pUVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                          (&pUVar24->portDecls,0);
      SVar38 = slang::syntax::SyntaxNode::sourceRange(&pUVar16->super_SyntaxNode);
      Scope::addDiag(scope,(DiagCode)0x770006,SVar38);
    }
  }
  else {
    pUVar13 = not_null<slang::syntax::UdpPortListSyntax_*>::get(this);
    if ((pUVar13->super_SyntaxNode).kind == NonAnsiUdpPortList) {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                  *)&__begin3);
      pSVar14 = &not_null<slang::syntax::UdpPortListSyntax_*>::get(this)->super_SyntaxNode;
      pNVar23 = slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiUdpPortListSyntax>(pSVar14);
      pSVar33 = &pNVar23->ports;
      __begin5.index = 0;
      __begin5.list = pSVar33;
      sVar2 = (pNVar23->ports).elements.size_;
      pSVar1 = &local_220->super_Scope;
      uVar20 = 0;
      pPVar31 = pSVar33;
      while ((pPVar31 != pSVar33 || (uVar20 != sVar2 + 1 >> 1))) {
        pIVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                  iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*(&__begin5);
        _port = pIVar22->identifier;
        name_2 = (Token)parsing::Token::valueText((Token *)&port);
        checkDup.scope = (Scope *)parsing::Token::location((Token *)&port);
        local_224 = In;
        pPVar19 = BumpAllocator::
                  emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                            (&local_1d0->super_BumpAllocator,local_1d0,
                             (basic_string_view<char,_std::char_traits<char>_> *)&name_2,
                             (SourceLocation *)&checkDup,&local_224);
        port_1 = pPVar19;
        SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
        emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)&ports,&port_1);
        Scope::addMember(pSVar1,(Symbol *)port_1);
        sVar39 = parsing::Token::valueText((Token *)&port);
        if (sVar39._M_len != 0) {
          name_2 = (Token)parsing::Token::valueText((Token *)&port);
          ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
          ::
          emplace<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
                      *)&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&name_2,
                     &port_1);
        }
        uVar20 = __begin5.index + 1;
        __begin5.index = uVar20;
        pPVar31 = __begin5.list;
      }
      checkDup.scope = scope;
      pUVar24 = not_null<slang::syntax::UdpBodySyntax_*>::get(&syntax->body);
      pSVar29 = &pUVar24->portDecls;
      __begin5.index = 0;
      __begin5.list = (ParentList *)pSVar29;
      sVar2 = (pUVar24->portDecls).elements.size_;
      uVar20 = 0;
      local_230 = (UdpOutputPortDeclSyntax *)0x0;
      pPVar31 = (ParentList *)pSVar29;
      while ((pPVar31 != (ParentList *)pSVar29 || (uVar20 != sVar2 + 1 >> 1))) {
        pUVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::
                  iterator_base<slang::syntax::UdpPortDeclSyntax_*>::operator*
                            ((iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)&__begin5);
        if ((pUVar16->super_SyntaxNode).kind == UdpOutputPortDecl) {
          pUVar17 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                              (&pUVar16->super_SyntaxNode);
          this_00 = &pUVar17->name;
          _port = (Token)parsing::Token::valueText(this_00);
          iVar25 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                   ::find(&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&port);
          if (iVar25.current ==
              local_80.entries + local_80.num_slots_minus_one + (long)local_80.max_lookups) {
            SVar38 = parsing::Token::range(this_00);
            pDVar28 = Scope::addDiag(scope,(DiagCode)0x800006,SVar38);
            sVar39 = parsing::Token::valueText(this_00);
            Diagnostic::operator<<(pDVar28,sVar39);
            pUVar17 = local_230;
          }
          else if (((pUVar17->reg).info == (Info *)0x0) || ((pUVar17->keyword).info != (Info *)0x0))
          {
            pPVar19 = ((iVar25.current)->field_1).value.second;
            nameToken.kind = (pUVar17->name).kind;
            nameToken._2_1_ = (pUVar17->name).field_0x2;
            nameToken.numFlags.raw = (pUVar17->name).numFlags.raw;
            nameToken.rawLen = (pUVar17->name).rawLen;
            nameToken.info = (pUVar17->name).info;
            fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
            operator()(&checkDup,pPVar19,nameToken);
            pPVar19->direction = OutReg - ((pUVar17->reg).info == (Info *)0x0);
            SVar18 = parsing::Token::location(this_00);
            (pPVar19->super_ValueSymbol).super_Symbol.location = SVar18;
            (pPVar19->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pUVar17;
            syntax_02.data_ =
                 (pUVar16->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
            syntax_02.size_ =
                 (pUVar16->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
            Symbol::setAttributes((Symbol *)pPVar19,scope,syntax_02);
            pUVar17 = local_230;
          }
          else if (local_230 != (UdpOutputPortDeclSyntax *)0x0) {
            SVar38 = parsing::Token::range(&pUVar17->reg);
            pDVar28 = Scope::addDiag(scope,(DiagCode)0x810006,SVar38);
            SVar18 = parsing::Token::location(&local_230->reg);
            Diagnostic::addNote(pDVar28,(DiagCode)0x80001,SVar18);
          }
        }
        else {
          pUVar21 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                              (&pUVar16->super_SyntaxNode);
          pSVar33 = &pUVar21->names;
          pIStack_1f0 = (Info *)0x0;
          port = (PrimitivePortSymbol *)pSVar33;
          sVar3 = (pUVar21->names).elements.size_;
          pIVar26 = (Info *)0x0;
          pPVar19 = (PrimitivePortSymbol *)pSVar33;
          while ((pPVar19 != (PrimitivePortSymbol *)pSVar33 ||
                 (pUVar17 = local_230, pIVar26 != (Info *)(sVar3 + 1 >> 1)))) {
            pIVar22 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                      iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*
                                ((iterator_base<slang::syntax::IdentifierNameSyntax_*> *)&port);
            name_2 = pIVar22->identifier;
            _port_1 = parsing::Token::valueText(&name_2);
            iVar25 = ska::detailv3::
                     sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                     ::find(&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&port_1);
            if (iVar25.current ==
                local_80.entries + local_80.num_slots_minus_one + (long)local_80.max_lookups) {
              SVar38 = parsing::Token::range(&name_2);
              pDVar28 = Scope::addDiag(scope,(DiagCode)0x800006,SVar38);
              sVar39 = parsing::Token::valueText(&name_2);
              Diagnostic::operator<<(pDVar28,sVar39);
            }
            else {
              pPVar19 = ((iVar25.current)->field_1).value.second;
              fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
              operator()(&checkDup,pPVar19,name_2);
              SVar18 = parsing::Token::location(&name_2);
              (pPVar19->super_ValueSymbol).super_Symbol.location = SVar18;
              (pPVar19->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pIVar22;
              sVar37.data_ = (pUVar16->attributes).
                             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                             .data_;
              sVar37.size_ = (pUVar16->attributes).
                             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                             .size_;
              Symbol::setAttributes((Symbol *)pPVar19,scope,sVar37);
            }
            pPVar19 = port;
            pIVar26 = (Info *)((long)&pIStack_1f0->rawTextPtr + 1);
            pIStack_1f0 = pIVar26;
          }
        }
        uVar20 = __begin5.index + 1;
        __begin5.index = uVar20;
        pPVar31 = __begin5.list;
        local_230 = pUVar17;
      }
      if (local_230 != (UdpOutputPortDeclSyntax *)0x0) {
        __begin5 = *(iterator *)&local_230->name;
        _port = (Token)parsing::Token::valueText((Token *)&__begin5);
        iVar25 = ska::detailv3::
                 sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                 ::find(&local_80,(basic_string_view<char,_std::char_traits<char>_> *)&port);
        if (iVar25.current ==
            local_80.entries + local_80.num_slots_minus_one + (long)local_80.max_lookups) {
          assert::assertFailed
                    ("it != portMap.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,0x36b,
                     "static PrimitiveSymbol &slang::ast::PrimitiveSymbol::fromSyntax(const Scope &, const UdpDeclarationSyntax &)"
                    );
        }
        pPVar19 = ((iVar25.current)->field_1).value.second;
        if ((pPVar19->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0) {
          if (pPVar19->direction == In) {
            SVar38 = parsing::Token::range((Token *)&__begin5);
            pDVar28 = Scope::addDiag(scope,(DiagCode)0x820006,SVar38);
            Diagnostic::operator<<(pDVar28,(pPVar19->super_ValueSymbol).super_Symbol.name);
          }
          else if (pPVar19->direction == OutReg) {
            fromSyntax(slang::ast::Scope_const&,slang::syntax::UdpDeclarationSyntax_const&)::$_0::
            operator()(&checkDup,pPVar19,(Token)__begin5);
          }
          else {
            pPVar19->direction = OutReg;
          }
        }
      }
      ppPVar6 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.data_;
      lVar35 = ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len << 3;
      for (lVar36 = 0; lVar35 != lVar36; lVar36 = lVar36 + 8) {
        lVar4 = *(long *)((long)ppPVar6 + lVar36);
        if (*(long *)(lVar4 + 0x38) == 0) {
          pDVar28 = Scope::addDiag(scope,(DiagCode)0x7f0006,*(SourceLocation *)(lVar4 + 0x18));
          Diagnostic::operator<<(pDVar28,*(string_view *)(lVar4 + 8));
        }
      }
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::~sherwood_v3_table(&local_80);
    }
    else {
      pUVar13 = not_null<slang::syntax::UdpPortListSyntax_*>::get(this);
      if ((pUVar13->super_SyntaxNode).kind != WildcardUdpPortList) {
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&port_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,(allocator<char> *)&local_224);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_1,
                       ":");
        std::__cxx11::to_string((string *)&checkDup,0x387);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name_2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &checkDup);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port,
                       ": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin5,"Default case should be unreachable!");
        std::logic_error::logic_error(this_02,(string *)&__begin3);
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  code.subsystem = Declarations;
  code.code = 0x83;
  pPVar12 = local_220;
  if (1 < ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len) {
    ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,0);
    if ((*ppPVar27)->direction != In) {
      ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                           (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,0)
      ;
      if ((*ppPVar27)->direction == OutReg) {
        local_220->isSequential = true;
        ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                             (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                              0);
        pSVar14 = ((*ppPVar27)->super_ValueSymbol).super_Symbol.originatingSyntax;
        if ((pSVar14 == (SyntaxNode *)0x0) || (pSVar14->kind != UdpOutputPortDecl))
        goto LAB_001aa0ab;
        pUVar17 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>(pSVar14);
        if (pUVar17->initializer == (EqualsValueClauseSyntax *)0x0) goto LAB_001aa0ab;
        pSVar14 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&pUVar17->initializer->expr)->
                   super_SyntaxNode;
      }
      else {
LAB_001aa0ab:
        pSVar14 = (SyntaxNode *)0x0;
      }
      for (uVar20 = 1;
          uVar20 < ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>.len;
          uVar20 = uVar20 + 1) {
        ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                             (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                              uVar20);
        if ((*ppPVar27)->direction != In) {
          ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                               (&ports.
                                 super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                                uVar20);
          Scope::addDiag(scope,(DiagCode)0x790006,
                         ((*ppPVar27)->super_ValueSymbol).super_Symbol.location);
          break;
        }
      }
      pUVar24 = not_null<slang::syntax::UdpBodySyntax_*>::get(&syntax->body);
      this_01 = pUVar24->initialStmt;
      pEVar32 = extraout_RDX_01;
      if (this_01 == (UdpInitialStmtSyntax *)0x0) {
LAB_001aa20b:
        if (pSVar14 == (SyntaxNode *)0x0) goto LAB_001aa107;
      }
      else {
        if (local_220->isSequential == false) {
          SVar38 = slang::syntax::SyntaxNode::sourceRange(&this_01->super_SyntaxNode);
          Scope::addDiag(scope,(DiagCode)0x7b0006,SVar38);
          pEVar32 = extraout_RDX_02;
          goto LAB_001aa20b;
        }
        if (pSVar14 == (SyntaxNode *)0x0) {
          pSVar14 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this_01->value)->
                     super_SyntaxNode;
          sVar39 = parsing::Token::valueText(&this_01->name);
          pEVar32 = (EVP_PKEY_CTX *)sVar39._M_str;
          if ((sVar39._M_len != 0) &&
             (ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                   (&ports.
                                     super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                                    0), pEVar32 = extraout_RDX_08,
             ((*ppPVar27)->super_ValueSymbol).super_Symbol.name._M_len != 0)) {
            ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                 (&ports.
                                   super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,0)
            ;
            __y._M_len = ((*ppPVar27)->super_ValueSymbol).super_Symbol.name._M_len;
            __y._M_str = ((*ppPVar27)->super_ValueSymbol).super_Symbol.name._M_str;
            bVar7 = std::operator!=(sVar39,__y);
            pEVar32 = extraout_RDX_09;
            if (bVar7) {
              SVar38 = parsing::Token::range(&this_01->name);
              pDVar28 = Scope::addDiag(scope,(DiagCode)0x840006,SVar38);
              Diagnostic::operator<<(pDVar28,sVar39);
              ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                                   (&ports.
                                     super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                                    0);
              Diagnostic::addNote(pDVar28,(DiagCode)0x40001,
                                  ((*ppPVar27)->super_ValueSymbol).super_Symbol.location);
              pEVar32 = extraout_RDX_10;
            }
          }
          goto LAB_001aa20b;
        }
        SVar38 = slang::syntax::SyntaxNode::sourceRange(&this_01->super_SyntaxNode);
        pDVar28 = Scope::addDiag(scope,(DiagCode)0x780006,SVar38);
        __begin3 = (iterator)slang::syntax::SyntaxNode::getFirstToken(pSVar14);
        SVar18 = parsing::Token::location((Token *)&__begin3);
        Diagnostic::addNote(pDVar28,(DiagCode)0x80001,SVar18);
      }
      lookupLocation._12_4_ = 0;
      lookupLocation.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
      lookupLocation.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
      ASTContext::ASTContext
                ((ASTContext *)&__begin3,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
      iVar10 = Expression::bind((int)pSVar14,(sockaddr *)&__begin3,0);
      this_03 = (Expression *)CONCAT44(extraout_var_00,iVar10);
      bVar7 = Expression::bad(this_03);
      pEVar32 = extraout_RDX_03;
      if (!bVar7) {
        if (this_03->kind == IntegerLiteral) {
          this_04 = not_null<const_slang::ast::Type_*>::get(&this_03->type);
          bVar11 = Type::getBitWidth(this_04);
          if ((bVar11 == 1) ||
             (bVar7 = Expression::isUnsizedInteger(this_03), pEVar32 = extraout_RDX_04, bVar7)) {
            ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)&__begin3,this_03,
                             (bitmask<slang::ast::EvalFlags>)0x0);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_58);
            pEVar32 = extraout_RDX_05;
            if (&this_03->constant->value !=
                (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)0x0) {
              this_05 = std::
                        get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                  (&this_03->constant->value);
              SVInt::SVInt<int,void>((SVInt *)&__begin5,0);
              lVar8 = SVInt::operator==(this_05,(SVInt *)&__begin5);
              SVInt::SVInt<int,void>((SVInt *)&port,1);
              lVar9 = SVInt::operator==(this_05,(SVInt *)&port);
              bVar7 = false;
              cVar34 = -0x80;
              if (lVar9.value == '\0' && lVar8.value == '\0') {
                cVar34 = '\0';
              }
              if (lVar9.value == '\x01') {
                cVar34 = '\x01';
              }
              if (lVar8.value == '\x01') {
                cVar34 = '\x01';
              }
              if ((this_05->super_SVIntStorage).bitWidth == 1) {
                lVar8 = SVInt::operator[](this_05,0);
                bVar7 = lVar8.value == 0x80;
              }
              SVInt::~SVInt((SVInt *)&port);
              SVInt::~SVInt((SVInt *)&__begin5);
              pEVar32 = extraout_RDX_06;
              if ((bVar7) || (cVar34 != '\0' && (cVar34 != -0x80 && cVar34 != '@'))) {
                local_220->initVal = this_03->constant;
              }
            }
          }
        }
        if (local_220->initVal == (ConstantValue *)0x0) {
          Scope::addDiag(scope,(DiagCode)0x7a0006,this_03->sourceRange);
          pEVar32 = extraout_RDX_07;
        }
      }
      goto LAB_001aa107;
    }
    ppPVar27 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::operator[]
                         (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,0);
    pPVar12 = (PrimitiveSymbol *)*ppPVar27;
    code.subsystem = Declarations;
    code.code = 0x7c;
  }
  Scope::addDiag(scope,code,(pPVar12->super_Symbol).location);
  pEVar32 = extraout_RDX;
LAB_001aa107:
  iVar10 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>,
                      (EVP_PKEY_CTX *)local_1d0,pEVar32);
  pPVar12 = local_220;
  (local_220->ports).data_ = (pointer)CONCAT44(extraout_var,iVar10);
  (local_220->ports).size_ = extraout_RDX_00;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::~SmallVectorBase
            (&ports.super_SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>);
  return pPVar12;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, syntax.name.valueText(), syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    SmallVector<const PrimitivePortSymbol*> ports;
    if (syntax.portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : syntax.portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (syntax.portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : syntax.portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                if (auto it = portMap.find(outputDecl.name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, outputDecl.name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = outputDecl.name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, outputDecl.name.range());
                    diag << outputDecl.name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else if (syntax.portList->kind == SyntaxKind::WildcardUdpPortList) {
        // TODO:
    }
    else {
        ASSUME_UNREACHABLE;
    }

    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }
    }

    // TODO: body

    prim->ports = ports.copy(comp);
    return *prim;
}